

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

peer_info * __thiscall nuraft::raft_server::get_peer_info(raft_server *this,int32 srv_id)

{
  bool bVar1;
  int32 iVar2;
  uint64_t uVar3;
  peer_info *in_RDI;
  ptr<peer> pp;
  const_iterator entry;
  unique_lock<std::recursive_mutex> guard;
  raft_server *in_stack_ffffffffffffff68;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_40 [3];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_28 [5];
  
  bVar1 = is_leader(in_stack_ffffffffffffff68);
  if (bVar1) {
    std::unique_lock<std::recursive_mutex>::unique_lock
              (in_stack_ffffffffffffff70,(mutex_type *)in_stack_ffffffffffffff68);
    local_28[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                 *)in_stack_ffffffffffffff68,(key_type *)0x223b84);
    local_40[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::__detail::operator==(local_28,local_40);
    if (bVar1) {
      peer_info::peer_info(in_RDI);
    }
    else {
      peer_info::peer_info(in_RDI);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x223c02);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff70,
                 (shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff68);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x223c22);
      iVar2 = peer::get_id((peer *)0x223c2a);
      in_RDI->id_ = iVar2;
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x223c45);
      in_stack_ffffffffffffff70 =
           (unique_lock<std::recursive_mutex> *)peer::get_last_accepted_log_idx((peer *)0x223c4d);
      in_RDI->last_log_idx_ = (ulong)in_stack_ffffffffffffff70;
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x223c6c);
      uVar3 = peer::get_resp_timer_us((peer *)0x223c74);
      in_RDI->last_succ_resp_us_ = uVar3;
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x223c99);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff70);
  }
  else {
    peer_info::peer_info(in_RDI);
  }
  return in_RDI;
}

Assistant:

raft_server::peer_info raft_server::get_peer_info(int32 srv_id) const {
    if (!is_leader()) return peer_info();

    recur_lock(lock_);
    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) return peer_info();

    peer_info ret;
    ptr<peer> pp = entry->second;
    ret.id_ = pp->get_id();
    ret.last_log_idx_ = pp->get_last_accepted_log_idx();
    ret.last_succ_resp_us_ = pp->get_resp_timer_us();
    return ret;
}